

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis_transcode.cpp
# Opt level: O0

ktx_error_code_e
ktxTexture2_transcodeLzEtc1s
          (ktxTexture2 *This,alpha_content_e alphaContent,ktxTexture2 *prototype,
          ktx_transcode_fmt_e outputFormat,ktx_transcode_flags transcodeFlags)

{
  ktx_uint32_t kVar1;
  ktxTexture2_private *pkVar2;
  long lVar3;
  ktx_uint8_t *pkVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  undefined4 *puVar9;
  long lVar10;
  ktx_uint64_t kVar11;
  ktx_size_t kVar12;
  size_type sVar13;
  void *pOutput_blocks;
  byte bVar14;
  long in_RDX;
  int in_ESI;
  ktxTexture2 *in_RDI;
  float fVar15;
  undefined1 auVar16 [16];
  bool status;
  basisu_transcoder_state *xcoderState;
  ktxBasisLzEtc1sImageDesc *imageDesc;
  uint32_t stateIndex;
  ktx_size_t levelSizeOut;
  ktx_size_t levelImageSizeOut;
  uint32_t endImage;
  uint32_t image;
  uint32_t numImages;
  uint32_t faceSlices;
  uint32_t depth;
  uint32_t levelBlocksY;
  uint32_t levelBlocksX;
  uint32_t bh;
  uint32_t bw;
  uint32_t levelHeight;
  uint32_t levelWidth;
  uint64_t writeOffsetBlocks;
  uint64_t writeOffset;
  uint64_t levelOffset;
  int32_t level_1;
  ktxBasisLzEtc1sImageDesc *imageDescs;
  uint64_t levelOffsetWrite;
  ktxLevelIndexEntry *protoLevelIndex;
  ktx_size_t xcodedDataLength;
  ktx_uint32_t outputBlockByteLength;
  ktx_uint8_t *pXcodedData;
  bool isVideo;
  vector<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
  xcoderStates;
  basisu_lowlevel_etc1s_transcoder bit;
  uint32_t *imageCount;
  uint32_t level;
  uint32_t layersFaces;
  uint32_t *firstImages;
  ktxBasisLzGlobalHeader *bgdh;
  uint8_t *bgd;
  ktx_error_code_e result;
  ktxTexture2_private *protoPriv;
  ktxTexture2_private *priv;
  ktx_uint32_t in_stack_fffffffffffffa8c;
  uint in_stack_fffffffffffffa90;
  undefined4 in_stack_fffffffffffffa94;
  uint in_stack_fffffffffffffaa0;
  uint uVar17;
  undefined4 in_stack_fffffffffffffaa4;
  undefined4 in_stack_fffffffffffffaa8;
  undefined4 in_stack_fffffffffffffaac;
  undefined4 in_stack_fffffffffffffab0;
  undefined4 in_stack_fffffffffffffab4;
  uint32_t in_stack_fffffffffffffabc;
  undefined4 in_stack_fffffffffffffac0;
  undefined4 in_stack_fffffffffffffac4;
  undefined4 in_stack_fffffffffffffac8;
  undefined4 in_stack_fffffffffffffacc;
  undefined4 in_stack_fffffffffffffad0;
  undefined4 in_stack_fffffffffffffad4;
  float local_4ec;
  uint local_4b4;
  uint uVar18;
  uint uVar19;
  uint local_48c;
  uint local_464;
  long local_460;
  uint local_448;
  undefined4 uVar20;
  uint32_t compressed_data_length;
  undefined4 in_stack_fffffffffffffbf8;
  ktx_uint32_t kVar21;
  void *local_3f8;
  uint32_t in_stack_fffffffffffffc40;
  uint32_t in_stack_fffffffffffffc48;
  uint32_t in_stack_fffffffffffffc50;
  uint32_t in_stack_fffffffffffffc58;
  uint32_t in_stack_fffffffffffffc60;
  uint32_t in_stack_fffffffffffffc68;
  uint32_t in_stack_fffffffffffffc70;
  uint32_t in_stack_fffffffffffffc78;
  uint32_t in_stack_fffffffffffffc80;
  uint32_t in_stack_fffffffffffffc88;
  uint32_t in_stack_fffffffffffffca0;
  basisu_transcoder_state *in_stack_fffffffffffffca8;
  uint32_t in_stack_fffffffffffffcb0;
  uint8_t *in_stack_fffffffffffffd38;
  uint32_t in_stack_fffffffffffffd40;
  uint32_t in_stack_fffffffffffffd44;
  uint8_t *in_stack_fffffffffffffd48;
  uint32_t in_stack_fffffffffffffd54;
  basisu_lowlevel_etc1s_transcoder *in_stack_fffffffffffffd58;
  uint32_t in_stack_fffffffffffffd70;
  uint local_90;
  ktx_error_code_e local_6c;
  ktx_error_code_e local_34;
  
  pkVar2 = in_RDI->_private;
  lVar3 = *(long *)(in_RDX + 0xa0);
  if (in_RDI->supercompressionScheme != KTX_SS_BASIS_LZ) {
    __assert_fail("This->supercompressionScheme == KTX_SS_BASIS_LZ",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/basis_transcode.cpp"
                  ,0x1d3,
                  "ktx_error_code_e ktxTexture2_transcodeLzEtc1s(ktxTexture2 *, alpha_content_e, ktxTexture2 *, ktx_transcode_fmt_e, ktx_transcode_flags)"
                 );
  }
  pkVar4 = pkVar2->_supercompressionGlobalData;
  if (((*(int *)(pkVar4 + 4) == 0) || (*(int *)(pkVar4 + 8) == 0)) || (*(int *)(pkVar4 + 0xc) == 0))
  {
    basisu::debug_printf("ktxTexture_TranscodeBasis: missing endpoints, selectors or tables");
    local_34 = KTX_FILE_DATA_ERROR;
  }
  else {
    auVar16 = ZEXT416(in_RDI->numLevels + 1) * ZEXT816(4);
    uVar8 = auVar16._0_8_;
    if (auVar16._8_8_ != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    puVar9 = (undefined4 *)operator_new__(uVar8);
    kVar21 = in_RDI->numLayers;
    kVar1 = in_RDI->numFaces;
    *puVar9 = 0;
    for (local_90 = 1; local_90 <= in_RDI->numLevels; local_90 = local_90 + 1) {
      if (in_RDI->baseDepth >> ((char)local_90 - 1U & 0x1f) < 2) {
        local_48c = 1;
      }
      else {
        local_48c = in_RDI->baseDepth >> ((char)local_90 - 1U & 0x1f);
      }
      puVar9[local_90] = puVar9[local_90 - 1] + kVar21 * kVar1 * local_48c;
    }
    if (pkVar2->_sgdByteLength <
        (ulong)(uint)puVar9[in_RDI->numLevels] * 0x14 + 0x14 + (ulong)*(uint *)(pkVar4 + 4) +
        (ulong)*(uint *)(pkVar4 + 8) + (ulong)*(uint *)(pkVar4 + 0xc)) {
      if (puVar9 != (undefined4 *)0x0) {
        operator_delete__(puVar9);
      }
      local_34 = KTX_FILE_DATA_ERROR;
    }
    else {
      basist::basisu_lowlevel_etc1s_transcoder::basisu_lowlevel_etc1s_transcoder
                ((basisu_lowlevel_etc1s_transcoder *)
                 CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0));
      std::vector<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
      ::vector((vector<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
                *)0x193246);
      std::vector<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
      ::resize((vector<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
                *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
               CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
      basist::basisu_lowlevel_etc1s_transcoder::decode_palettes
                (in_stack_fffffffffffffd58,in_stack_fffffffffffffd54,in_stack_fffffffffffffd48,
                 in_stack_fffffffffffffd44,in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                 in_stack_fffffffffffffd70);
      basist::basisu_lowlevel_etc1s_transcoder::decode_tables
                ((basisu_lowlevel_etc1s_transcoder *)
                 CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
                 (uint8_t *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                 in_stack_fffffffffffffabc);
      lVar10 = lVar3 + 0x20;
      local_3f8 = (void *)0x0;
      kVar21 = in_RDI->numLevels;
      while (kVar21 = kVar21 - 1, -1 < (int)kVar21) {
        kVar11 = ktxTexture2_levelDataOffset(in_RDI,kVar21);
        bVar14 = (byte)kVar21;
        if (in_RDI->baseWidth >> (bVar14 & 0x1f) == 0) {
          uVar19 = 1;
        }
        else {
          uVar19 = in_RDI->baseWidth >> (bVar14 & 0x1f);
        }
        if (in_RDI->baseHeight >> (bVar14 & 0x1f) == 0) {
          uVar18 = 1;
        }
        else {
          uVar18 = in_RDI->baseHeight >> (bVar14 & 0x1f);
        }
        compressed_data_length = 4;
        uVar20 = 0;
        uVar6 = uVar18 + 3;
        if (in_RDI->baseDepth >> (bVar14 & 0x1f) == 0) {
          local_4b4 = 1;
        }
        else {
          local_4b4 = in_RDI->baseDepth >> (bVar14 & 0x1f);
        }
        local_448 = puVar9[(int)kVar21];
        uVar7 = local_448 + in_RDI->numLayers * in_RDI->numFaces * local_4b4;
        local_464 = 0;
        local_460 = 0;
        pOutput_blocks = local_3f8;
        kVar12 = ktxTexture2_GetImageSize
                           ((ktxTexture2 *)
                            CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                            in_stack_fffffffffffffa8c);
        uVar17 = in_stack_fffffffffffffaa0;
        in_stack_fffffffffffffaa0 = uVar18;
        for (; local_448 < uVar7; local_448 = local_448 + 1) {
          std::
          vector<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
          ::operator[]((vector<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
                        *)&stack0xfffffffffffffc40,(ulong)local_464);
          local_464 = local_464 + 1;
          sVar13 = std::
                   vector<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
                   ::size((vector<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
                           *)&stack0xfffffffffffffc40);
          if (local_464 == sVar13) {
            local_464 = 0;
          }
          if ((in_ESI != 0) &&
             ((*(int *)(pkVar4 + (ulong)local_448 * 0x14 + 0x20) == 0 ||
              (*(int *)(pkVar4 + (ulong)local_448 * 0x14 + 0x24) == 0)))) {
            local_34 = KTX_FILE_DATA_ERROR;
            goto LAB_00193a88;
          }
          in_stack_fffffffffffffa90 = uVar6 >> 2;
          uVar18 = in_stack_fffffffffffffaa0;
          bVar5 = basist::basisu_lowlevel_etc1s_transcoder::transcode_image
                            ((basisu_lowlevel_etc1s_transcoder *)
                             CONCAT44(kVar21,in_stack_fffffffffffffbf8),
                             (transcoder_texture_format)(kVar11 >> 0x20),pOutput_blocks,0,
                             (uint8_t *)CONCAT44(uVar19,in_stack_fffffffffffffaa0),
                             compressed_data_length,in_stack_fffffffffffffc40,
                             in_stack_fffffffffffffc48,in_stack_fffffffffffffc50,
                             in_stack_fffffffffffffc58,in_stack_fffffffffffffc60,
                             in_stack_fffffffffffffc68,in_stack_fffffffffffffc70,
                             in_stack_fffffffffffffc78,in_stack_fffffffffffffc80,
                             in_stack_fffffffffffffc88,SUB41((uint)uVar20 >> 0x18,0),
                             SUB41((uint)uVar20 >> 0x10,0),in_stack_fffffffffffffca0,
                             in_stack_fffffffffffffca8,in_stack_fffffffffffffcb0);
          if (!bVar5) {
            local_6c = KTX_TRANSCODE_FAILED;
            goto LAB_00193a52;
          }
          pOutput_blocks = (void *)(kVar12 + (long)pOutput_blocks);
          local_460 = kVar12 + local_460;
          uVar17 = in_stack_fffffffffffffaa0;
          in_stack_fffffffffffffaa0 = uVar18;
        }
        *(void **)(lVar10 + (long)(int)kVar21 * 0x18) = local_3f8;
        *(long *)(lVar10 + (long)(int)kVar21 * 0x18 + 8) = local_460;
        *(long *)(lVar10 + (long)(int)kVar21 * 0x18 + 0x10) = local_460;
        if ((void *)(local_460 + (long)local_3f8) != pOutput_blocks) {
          __assert_fail("levelOffsetWrite == writeOffset",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/basis_transcode.cpp"
                        ,0x27a,
                        "ktx_error_code_e ktxTexture2_transcodeLzEtc1s(ktxTexture2 *, alpha_content_e, ktxTexture2 *, ktx_transcode_fmt_e, ktx_transcode_flags)"
                       );
        }
        fVar15 = (float)*(uint *)(lVar3 + 8);
        local_4ec = (float)(void *)(local_460 + (long)local_3f8);
        auVar16 = ZEXT416((uint)(local_4ec / fVar15));
        auVar16 = roundss(auVar16,auVar16,10);
        local_3f8 = (void *)((long)(fVar15 * auVar16._0_4_) & 0xffffffff);
        in_stack_fffffffffffffaa0 = uVar17;
      }
      local_6c = KTX_SUCCESS;
LAB_00193a52:
      uVar17 = in_stack_fffffffffffffaa0;
      if (puVar9 != (undefined4 *)0x0) {
        operator_delete__(puVar9);
        uVar17 = in_stack_fffffffffffffaa0;
      }
      local_34 = local_6c;
LAB_00193a88:
      std::vector<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
      ::~vector((vector<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
                 *)CONCAT44(in_stack_fffffffffffffaa4,uVar17));
      basist::basisu_lowlevel_etc1s_transcoder::~basisu_lowlevel_etc1s_transcoder
                ((basisu_lowlevel_etc1s_transcoder *)
                 CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
    }
  }
  return local_34;
}

Assistant:

KTX_error_code
ktxTexture2_transcodeLzEtc1s(ktxTexture2* This,
                             alpha_content_e alphaContent,
                             ktxTexture2* prototype,
                             ktx_transcode_fmt_e outputFormat,
                             ktx_transcode_flags transcodeFlags)
{
    DECLARE_PRIVATE(priv, This);
    DECLARE_PRIVATE(protoPriv, prototype);
    KTX_error_code result = KTX_SUCCESS;

    assert(This->supercompressionScheme == KTX_SS_BASIS_LZ);

    uint8_t* bgd = priv._supercompressionGlobalData;
    ktxBasisLzGlobalHeader& bgdh = *reinterpret_cast<ktxBasisLzGlobalHeader*>(bgd);
    if (!(bgdh.endpointsByteLength && bgdh.selectorsByteLength && bgdh.tablesByteLength)) {
        debug_printf("ktxTexture_TranscodeBasis: missing endpoints, selectors or tables");
        return KTX_FILE_DATA_ERROR;
    }

    // Compute some helpful numbers.
    //
    // firstImages contains the indices of the first images for each level to
    // ease finding the correct slice description when iterating from smallest
    // level to largest or when randomly accessing them (t.b.c). The last array
    // entry contains the total number of images, for calculating the offsets
    // of the endpoints, etc.
    uint32_t* firstImages = new uint32_t[This->numLevels+1];

    // Temporary invariant value
    uint32_t layersFaces = This->numLayers * This->numFaces;
    firstImages[0] = 0;
    for (uint32_t level = 1; level <= This->numLevels; level++) {
        // NOTA BENE: numFaces * depth is only reasonable because they can't
        // both be > 1. I.e there are no 3d cubemaps.
        firstImages[level] = firstImages[level - 1]
                           + layersFaces * MAX(This->baseDepth >> (level - 1), 1);
    }
    uint32_t& imageCount = firstImages[This->numLevels];

    if (BGD_TABLES_ADDR(0, bgdh, imageCount) + bgdh.tablesByteLength > priv._sgdByteLength) {
        // Compiler will not allow `goto cleanup;` because "jump bypasses variable initialization."
        // The static initializations below this and before the loop are presumably the issue
        // as the compiler is,presumably, inserting code to destruct those at the end of the
        // function.
        delete[] firstImages;
        return KTX_FILE_DATA_ERROR;
    }
    // FIXME: Do more validation.

    // Prepare low-level transcoder for transcoding slices.
    basist::basisu_lowlevel_etc1s_transcoder bit;

    // basisu_transcoder_state is used to find the previous frame when
    // decoding a video P-Frame. It tracks the previous frame for each mip
    // level. For cube map array textures we need to find the previous frame
    // for each face so we a state per face. Although providing this is only
    // needed for video, it is easier to always pass our own.
    std::vector<basisu_transcoder_state> xcoderStates;
    xcoderStates.resize(This->isVideo ? This->numFaces : 1);

    bit.decode_palettes(bgdh.endpointCount, BGD_ENDPOINTS_ADDR(bgd, imageCount),
                        bgdh.endpointsByteLength,
                        bgdh.selectorCount, BGD_SELECTORS_ADDR(bgd, bgdh, imageCount),
                        bgdh.selectorsByteLength);

    bit.decode_tables(BGD_TABLES_ADDR(bgd, bgdh, imageCount),
                      bgdh.tablesByteLength);

    // Find matching VkFormat and calculate output sizes.

    const bool isVideo = This->isVideo;

    ktx_uint8_t* pXcodedData = prototype->pData;
    // Inconveniently, the output buffer size parameter of transcode_image
    // has to be in pixels for uncompressed output and in blocks for
    // compressed output. The only reason for humouring the API is so
    // its buffer size tests provide a real check. An alternative is to
    // always provide the size in bytes which will always pass.
    ktx_uint32_t outputBlockByteLength
                      = prototype->_protected->_formatSize.blockSizeInBits / 8;
    ktx_size_t xcodedDataLength
                      = prototype->dataSize / outputBlockByteLength;
    ktxLevelIndexEntry* protoLevelIndex;
    uint64_t levelOffsetWrite;
    const ktxBasisLzEtc1sImageDesc* imageDescs = BGD_ETC1S_IMAGE_DESCS(bgd);

    // Finally we're ready to transcode the slices.

    // FIXME: Iframe flag needs to be queryable by the application. In Basis
    // the app can query file_info and image_info from the transcoder which
    // returns a structure with lots of info about the image.

    protoLevelIndex = protoPriv._levelIndex;
    levelOffsetWrite = 0;
    for (int32_t level = This->numLevels - 1; level >= 0; level--) {
        uint64_t levelOffset = ktxTexture2_levelDataOffset(This, level);
        uint64_t writeOffset = levelOffsetWrite;
        uint64_t writeOffsetBlocks = levelOffsetWrite / outputBlockByteLength;
        uint32_t levelWidth = MAX(1, This->baseWidth >> level);
        uint32_t levelHeight = MAX(1, This->baseHeight >> level);
        // ETC1S texel block dimensions
        const uint32_t bw = 4, bh = 4;
        uint32_t levelBlocksX = (levelWidth + (bw - 1)) / bw;
        uint32_t levelBlocksY = (levelHeight + (bh - 1)) / bh;
        uint32_t depth = MAX(1, This->baseDepth >> level);
        //uint32_t faceSlices = This->numFaces == 1 ? depth : This->numFaces;
        uint32_t faceSlices = This->numFaces * depth;
        uint32_t numImages = This->numLayers * faceSlices;
        uint32_t image = firstImages[level];
        uint32_t endImage = image + numImages;
        ktx_size_t levelImageSizeOut, levelSizeOut;
        uint32_t stateIndex = 0;

        levelSizeOut = 0;
        // FIXME: Figure out a way to get the size out of the transcoder.
        levelImageSizeOut = ktxTexture2_GetImageSize(prototype, level);
        for (; image < endImage; image++) {
            const ktxBasisLzEtc1sImageDesc& imageDesc = imageDescs[image];

            basisu_transcoder_state& xcoderState = xcoderStates[stateIndex];
            // We have face0 [face1 ...] within each layer. Use `stateIndex`
            // rather than a double loop of layers and faceSlices as this
            // works for 3d texture and non-array cube maps as well as
            // cube map arrays without special casing.
            if (++stateIndex == xcoderStates.size())
                stateIndex = 0;

            if (alphaContent != eNone)
            {
                // The slice descriptions should have alpha information.
                if (imageDesc.alphaSliceByteOffset == 0
                    || imageDesc.alphaSliceByteLength == 0)
                    return KTX_FILE_DATA_ERROR;
            }

            bool status;
            status = bit.transcode_image(
                      (transcoder_texture_format)outputFormat,
                      pXcodedData + writeOffset,
                      (uint32_t)(xcodedDataLength - writeOffsetBlocks),
                      This->pData,
                      (uint32_t)This->dataSize,
                      levelBlocksX,
                      levelBlocksY,
                      levelWidth,
                      levelHeight,
                      level,
                      (uint32_t)(levelOffset + imageDesc.rgbSliceByteOffset),
                      imageDesc.rgbSliceByteLength,
                      (uint32_t)(levelOffset + imageDesc.alphaSliceByteOffset),
                      imageDesc.alphaSliceByteLength,
                      transcodeFlags,
                      alphaContent != eNone,
                      isVideo,
                      // Our P-Frame flag is in the same bit as
                      // cSliceDescFlagsFrameIsIFrame. We have to
                      // invert it to make it an I-Frame flag.
                      //
                      // API currently doesn't have any way to pass
                      // the I-Frame flag.
                      //imageDesc.imageFlags ^ cSliceDescFlagsFrameIsIFrame,
                      0, // output_row_pitch_in_blocks_or_pixels
                      &xcoderState,
                      0  // output_rows_in_pixels
                      );
            if (!status) {
                result = KTX_TRANSCODE_FAILED;
                goto cleanup;
            }

            writeOffset += levelImageSizeOut;
            levelSizeOut += levelImageSizeOut;
        } // end images loop
        protoLevelIndex[level].byteOffset = levelOffsetWrite;
        protoLevelIndex[level].byteLength = levelSizeOut;
        protoLevelIndex[level].uncompressedByteLength = levelSizeOut;
        levelOffsetWrite += levelSizeOut;
        assert(levelOffsetWrite == writeOffset);
        // In case of transcoding to uncompressed.
        levelOffsetWrite = _KTX_PADN(protoPriv._requiredLevelAlignment,
                                     levelOffsetWrite);
    } // level loop

    result = KTX_SUCCESS;

cleanup:
    delete[] firstImages;
    return result;
}